

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBasePrivate::connectOutputInterface
          (QFutureInterfaceBasePrivate *this,QFutureCallOutInterface *iface)

{
  bool bVar1;
  uint uVar2;
  QFutureCallOutEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ResultIteratorBase RVar3;
  int end;
  int begin;
  int currentState;
  ResultIteratorBase it;
  QMutexLocker<QMutex> locker;
  int in_stack_fffffffffffffc78;
  CallOutType in_stack_fffffffffffffc7c;
  QFutureCallOutEvent *in_stack_fffffffffffffc80;
  ResultStoreBase *in_stack_fffffffffffffc88;
  QFutureCallOutEvent *pQVar4;
  QFutureCallOutEvent *in_stack_fffffffffffffc90;
  undefined1 local_2a0 [56];
  undefined1 local_268 [56];
  undefined1 local_230 [56];
  undefined1 local_1f8 [56];
  undefined1 local_1c0 [56];
  const_iterator local_188;
  int local_180;
  const_iterator local_178;
  int local_170;
  undefined1 local_150 [56];
  undefined1 local_118 [56];
  undefined1 local_e0 [56];
  undefined1 local_a8 [56];
  undefined1 local_70 [56];
  const_iterator local_38;
  int local_30;
  const_iterator local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_fffffffffffffc80,
             (QMutex *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  uVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6df68b);
  if ((uVar2 & 2) != 0) {
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
    (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_70);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
    bVar1 = QScopedPointer::operator_cast_to_bool
                      ((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                        *)0x6df707);
    if (bVar1) {
      QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
      ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                    *)(in_RDI + 200));
      QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
      ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                    *)(in_RDI + 200));
      QFutureCallOutEvent::QFutureCallOutEvent
                (in_stack_fffffffffffffc90,(CallOutType)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                 (int)in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_a8);
      QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
      QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
      ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                    *)(in_RDI + 200));
      QFutureCallOutEvent::QFutureCallOutEvent
                (in_stack_fffffffffffffc90,(CallOutType)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                 (int)in_stack_fffffffffffffc88,(QString *)in_stack_fffffffffffffc80);
      (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_e0);
      QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
    }
    else {
      QFutureCallOutEvent::QFutureCallOutEvent
                (in_stack_fffffffffffffc90,(CallOutType)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                 (int)in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_118);
      QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
      QString::QString((QString *)0x6df93e);
      QFutureCallOutEvent::QFutureCallOutEvent
                (in_stack_fffffffffffffc90,(CallOutType)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                 (int)in_stack_fffffffffffffc88,(QString *)in_stack_fffffffffffffc80);
      (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_150);
      QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
      QString::~QString((QString *)0x6df98d);
    }
  }
  if ((*(byte *)(in_RDI + 0xd6) & 1) == 0) {
    local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    RVar3 = QtPrivate::ResultStoreBase::begin(in_stack_fffffffffffffc88);
    local_178._M_node = (_Base_ptr)RVar3.mapIterator.i._M_node;
    local_170 = RVar3.m_vectorIndex;
    puStack_20 = (undefined1 *)CONCAT44(puStack_20._4_4_,local_170);
    local_28._M_node = local_178._M_node;
    while( true ) {
      RVar3 = QtPrivate::ResultStoreBase::end(in_stack_fffffffffffffc88);
      local_188._M_node = (_Base_ptr)RVar3.mapIterator.i._M_node;
      local_180 = RVar3.m_vectorIndex;
      local_38._M_node = local_188._M_node;
      local_30 = local_180;
      bVar1 = QtPrivate::operator!=
                        ((ResultIteratorBase *)in_stack_fffffffffffffc80,
                         (ResultIteratorBase *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      if (!bVar1) break;
      QtPrivate::ResultIteratorBase::resultIndex((ResultIteratorBase *)in_stack_fffffffffffffc80);
      QtPrivate::ResultIteratorBase::batchSize((ResultIteratorBase *)0x6dfb32);
      QFutureCallOutEvent::QFutureCallOutEvent
                (in_stack_fffffffffffffc90,(CallOutType)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                 (int)in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_1c0);
      QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
      QtPrivate::ResultIteratorBase::batchedAdvance((ResultIteratorBase *)in_stack_fffffffffffffc80)
      ;
    }
  }
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 & 0x10) != 0) {
      pQVar4 = in_RSI;
      QFutureCallOutEvent::QFutureCallOutEvent
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
      (*(pQVar4->super_QEvent)._vptr_QEvent[2])(pQVar4,local_230);
      QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
    }
  }
  else {
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
    (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_1f8);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
  }
  if ((uVar2 & 8) != 0) {
    pQVar4 = in_RSI;
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
    (*(pQVar4->super_QEvent)._vptr_QEvent[2])(pQVar4,local_268);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_fffffffffffffc80);
  }
  if ((uVar2 & 4) != 0) {
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_RSI,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
    (*(in_RSI->super_QEvent)._vptr_QEvent[2])(in_RSI,local_2a0);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_RSI);
    in_stack_fffffffffffffc80 = in_RSI;
  }
  QList<QFutureCallOutInterface_*>::append
            ((QList<QFutureCallOutInterface_*> *)0x6dfe10,
             (parameter_type)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_fffffffffffffc80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBasePrivate::connectOutputInterface(QFutureCallOutInterface *iface)
{
    QMutexLocker locker(&m_mutex);

    const auto currentState = state.loadRelaxed();
    if (currentState & QFutureInterfaceBase::Started) {
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Started));
        if (m_progress) {
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange,
                                                        m_progress->minimum,
                                                        m_progress->maximum));
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                                        m_progressValue,
                                                        m_progress->text));
        } else {
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange,
                                                        0,
                                                        0));
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                                        m_progressValue,
                                                        QString()));
        }
    }

    if (!hasException) {
        QtPrivate::ResultIteratorBase it = data.m_results.begin();
        while (it != data.m_results.end()) {
            const int begin = it.resultIndex();
            const int end = begin + it.batchSize();
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ResultsReady,
                                                        begin,
                                                        end));
            it.batchedAdvance();
        }
    }

    if (currentState & QFutureInterfaceBase::Suspended)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Suspended));
    else if (currentState & QFutureInterfaceBase::Suspending)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Suspending));

    if (currentState & QFutureInterfaceBase::Canceled)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Canceled));

    if (currentState & QFutureInterfaceBase::Finished)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Finished));

    outputConnections.append(iface);
}